

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

void uv__signal_stop(uv_signal_t *handle)

{
  int iVar1;
  uv_signal_t *puVar2;
  int ret;
  int first_oneshot;
  int rem_oneshot;
  uv_signal_t *first_handle;
  sigset_t saved_sigmask;
  uv_signal_t *removed_handle;
  uv_signal_t *handle_local;
  
  if (handle->signum != 0) {
    uv__signal_block_and_lock((sigset_t *)&first_handle);
    saved_sigmask.__val[0xf] = (unsigned_long)uv__signal_tree_s_RB_REMOVE(&uv__signal_tree,handle);
    if ((uv_signal_t *)saved_sigmask.__val[0xf] != handle) {
      __assert_fail("removed_handle == handle",
                    "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/signal.c"
                    ,0x23e,"void uv__signal_stop(uv_signal_t *)");
    }
    puVar2 = uv__signal_first_handle(handle->signum);
    if (puVar2 == (uv_signal_t *)0x0) {
      uv__signal_unregister_handler(handle->signum);
    }
    else if ((((puVar2->flags & 0x2000000) != 0) && ((handle->flags & 0x2000000) == 0)) &&
            (iVar1 = uv__signal_register_handler(handle->signum,1), iVar1 != 0)) {
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/signal.c"
                    ,0x24c,"void uv__signal_stop(uv_signal_t *)");
    }
    uv__signal_unlock_and_unblock((sigset_t *)&first_handle);
    handle->signum = 0;
    if (((handle->flags & 4) != 0) &&
       (handle->flags = handle->flags & 0xfffffffb, (handle->flags & 8) != 0)) {
      handle->loop->active_handles = handle->loop->active_handles - 1;
    }
  }
  return;
}

Assistant:

static void uv__signal_stop(uv_signal_t* handle) {
  uv_signal_t* removed_handle;
  sigset_t saved_sigmask;
  uv_signal_t* first_handle;
  int rem_oneshot;
  int first_oneshot;
  int ret;

  /* If the watcher wasn't started, this is a no-op. */
  if (handle->signum == 0)
    return;

  uv__signal_block_and_lock(&saved_sigmask);

  removed_handle = RB_REMOVE(uv__signal_tree_s, &uv__signal_tree, handle);
  assert(removed_handle == handle);
  (void) removed_handle;

  /* Check if there are other active signal watchers observing this signal. If
   * not, unregister the signal handler.
   */
  first_handle = uv__signal_first_handle(handle->signum);
  if (first_handle == NULL) {
    uv__signal_unregister_handler(handle->signum);
  } else {
    rem_oneshot = handle->flags & UV_SIGNAL_ONE_SHOT;
    first_oneshot = first_handle->flags & UV_SIGNAL_ONE_SHOT;
    if (first_oneshot && !rem_oneshot) {
      ret = uv__signal_register_handler(handle->signum, 1);
      assert(ret == 0);
      (void)ret;
    }
  }

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signum = 0;
  uv__handle_stop(handle);
}